

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaTypePtr
xmlSchemaParseSimpleType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  byte *pbVar1;
  uint uVar2;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypePtr annItem;
  bool bVar4;
  int iVar5;
  xmlAttrPtr pxVar6;
  xmlSchemaTypePtr pxVar7;
  xmlSchemaAnnotPtr pxVar8;
  xmlSchemaTypePtr pxVar9;
  xmlAttrPtr ownerItem;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar10;
  _xmlNode *node_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr pxVar11;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlSchemaBasicItemPtr extraout_RDX_10;
  xmlSchemaBasicItemPtr extraout_RDX_11;
  xmlSchemaBasicItemPtr extraout_RDX_12;
  xmlParserErrors error;
  xmlChar **in_R8;
  char *in_R9;
  _xmlAttr *p_Var12;
  xmlChar **ppxVar13;
  xmlChar *attrValue;
  ulong in_stack_ffffffffffffff88;
  undefined4 uVar14;
  xmlChar **local;
  undefined8 in_stack_ffffffffffffff90;
  xmlChar *in_stack_ffffffffffffff98;
  xmlAttrPtr local_48;
  int local_3c;
  xmlChar **local_38;
  
  uVar14 = (undefined4)(in_stack_ffffffffffffff88 >> 0x20);
  pxVar10 = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  local_48 = (xmlAttrPtr)0x0;
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTypePtr)0x0;
  }
  local_3c = topLevel;
  if (topLevel == 0) {
    local = (xmlChar **)(in_stack_ffffffffffffff88 & 0xffffffff00000000);
    pxVar6 = (xmlAttrPtr)0x0;
    pxVar7 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar7 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar7->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar7->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    pxVar11 = extraout_RDX;
    for (p_Var12 = node->properties; p_Var12 != (_xmlAttr *)0x0; p_Var12 = p_Var12->next) {
      if (p_Var12->ns == (xmlNs *)0x0) {
        iVar5 = xmlStrEqual(p_Var12->name,"id");
        pxVar11 = extraout_RDX_02;
        if (iVar5 == 0) goto LAB_001981a9;
      }
      else {
        iVar5 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar11 = extraout_RDX_00;
        if (iVar5 != 0) {
LAB_001981a9:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var12,pxVar11,pxVar6);
          pxVar11 = extraout_RDX_01;
        }
      }
    }
  }
  else {
    pxVar6 = xmlSchemaGetPropNode(node,"name");
    if (pxVar6 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1cc014,pxVar10,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar7 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar5 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar6,(xmlAttrPtr)pxVar7,
                       (xmlSchemaTypePtr)&local_48,in_R8);
    if (iVar5 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (ctxt->isS4S != 0) {
      if (ctxt->isRedefine != 0) {
        xmlSchemaPCustomErrExt
                  (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
                   "Redefinition of built-in simple types is not supported",(xmlChar *)0x0,
                   (xmlChar *)0x0,(xmlChar *)0x0);
        return (xmlSchemaTypePtr)0x0;
      }
      pxVar7 = xmlSchemaGetPredefinedType
                         ((xmlChar *)local_48,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (pxVar7 != (xmlSchemaTypePtr)0x0) {
        return pxVar7;
      }
    }
    local = (xmlChar **)CONCAT44(uVar14,1);
    pxVar6 = local_48;
    pxVar7 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)local_48,
                              ctxt->targetNamespace,node,1);
    iVar5 = (int)in_stack_ffffffffffffff90;
    if (pxVar7 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar7->type = XML_SCHEMA_TYPE_SIMPLE;
    pxVar7->contentType = XML_SCHEMA_CONTENT_SIMPLE;
    *(byte *)&pxVar7->flags = (byte)pxVar7->flags | 8;
    for (p_Var12 = node->properties; p_Var12 != (_xmlAttr *)0x0; p_Var12 = p_Var12->next) {
      if (p_Var12->ns == (xmlNs *)0x0) {
        iVar5 = xmlStrEqual(p_Var12->name,"id");
        if (((iVar5 == 0) && (iVar5 = xmlStrEqual(p_Var12->name,"name"), iVar5 == 0)) &&
           (iVar5 = xmlStrEqual(p_Var12->name,(xmlChar *)"final"), pxVar11 = extraout_RDX_09,
           iVar5 == 0)) goto LAB_00198452;
      }
      else {
        iVar5 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar11 = extraout_RDX_08;
        if (iVar5 != 0) {
LAB_00198452:
          xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var12,pxVar11,pxVar6);
        }
      }
      iVar5 = (int)in_stack_ffffffffffffff90;
    }
    ownerItem = xmlSchemaGetPropNode(node,"final");
    if (ownerItem == (xmlAttrPtr)0x0) {
      uVar2 = schema->flags;
      if ((uVar2 & 8) != 0) {
        pbVar1 = (byte *)((long)&pxVar7->flags + 1);
        *pbVar1 = *pbVar1 | 4;
      }
      if ((uVar2 & 0x10) != 0) {
        pbVar1 = (byte *)((long)&pxVar7->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      pxVar11 = extraout_RDX_10;
      if ((uVar2 & 0x20) != 0) {
        pbVar1 = (byte *)((long)&pxVar7->flags + 1);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    else {
      local_48 = (xmlAttrPtr)xmlSchemaGetProp(ctxt,node,"final");
      local = (xmlChar **)CONCAT44((int)((ulong)local >> 0x20),0x1000);
      pxVar6 = (xmlAttrPtr)0x400;
      iVar5 = xmlSchemaPValAttrBlockFinal
                        ((xmlChar *)local_48,&pxVar7->flags,-1,0x400,-1,0x800,0x1000,iVar5);
      pxVar11 = extraout_RDX_11;
      if (iVar5 != 0) {
        local = (xmlChar **)0x0;
        pxVar6 = (xmlAttrPtr)0x0;
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)ownerItem,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(#all | List of (list | union | restriction)",
                   (char *)local_48,(xmlChar *)0x0,(char *)0x0,in_stack_ffffffffffffff98,
                   (xmlChar *)schema);
        pxVar11 = extraout_RDX_12;
      }
    }
  }
  pxVar7->targetNamespace = ctxt->targetNamespace;
  xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar11);
  pxVar3 = ctxt->ctxtType;
  ctxt->ctxtType = pxVar7;
  pxVar10 = node->children;
  if (pxVar10 == (xmlNodePtr)0x0) {
LAB_001982ce:
    bVar4 = false;
    error = XML_SCHEMAP_S4S_ELEM_MISSING;
    pxVar10 = (xmlNodePtr)0x0;
  }
  else {
    if (((pxVar10->ns != (xmlNs *)0x0) &&
        (iVar5 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
       (iVar5 = xmlStrEqual(pxVar10->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar5 != 0)) {
      pxVar8 = xmlSchemaParseAnnotation(ctxt,pxVar10,1);
      pxVar7->annot = pxVar8;
      pxVar10 = pxVar10->next;
      if (pxVar10 == (_xmlNode *)0x0) goto LAB_001982ce;
    }
    if (pxVar10->ns == (xmlNs *)0x0) {
LAB_0019857a:
      bVar4 = false;
    }
    else {
      iVar5 = xmlStrEqual(pxVar10->name,(xmlChar *)"restriction");
      if ((iVar5 == 0) ||
         (iVar5 = xmlStrEqual(pxVar10->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar5 == 0)) {
        if (pxVar10->ns == (xmlNs *)0x0) goto LAB_0019857a;
        iVar5 = xmlStrEqual(pxVar10->name,"list");
        if ((iVar5 == 0) ||
           (iVar5 = xmlStrEqual(pxVar10->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) {
          if ((pxVar10->ns == (xmlNs *)0x0) ||
             ((iVar5 = xmlStrEqual(pxVar10->name,"union"), iVar5 == 0 ||
              (iVar5 = xmlStrEqual(pxVar10->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar5 == 0)))) goto LAB_0019857a;
          xmlSchemaParseUnion(ctxt,schema,pxVar10);
        }
        else {
          annItem = ctxt->ctxtType;
          annItem->flags = annItem->flags | 0x40;
          pxVar9 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
          annItem->baseType = pxVar9;
          pxVar11 = extraout_RDX_03;
          for (p_Var12 = pxVar10->properties; p_Var12 != (_xmlAttr *)0x0; p_Var12 = p_Var12->next) {
            if (p_Var12->ns == (xmlNs *)0x0) {
              iVar5 = xmlStrEqual(p_Var12->name,"id");
              pxVar11 = extraout_RDX_06;
              if ((iVar5 == 0) &&
                 (iVar5 = xmlStrEqual(p_Var12->name,(xmlChar *)"itemType"),
                 pxVar11 = extraout_RDX_07, iVar5 == 0)) goto LAB_0019837a;
            }
            else {
              iVar5 = xmlStrEqual(p_Var12->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar11 = extraout_RDX_04;
              if (iVar5 != 0) {
LAB_0019837a:
                xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var12,pxVar11,pxVar6);
                pxVar11 = extraout_RDX_05;
              }
            }
          }
          xmlSchemaPValAttrID(ctxt,pxVar10,(xmlChar *)pxVar11);
          local_38 = &annItem->base;
          xmlSchemaPValAttrQName
                    (ctxt,schema,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)"itemType",
                     (char *)&annItem->baseNs,local_38,local);
          node_00 = pxVar10->children;
          if (node_00 == (xmlNodePtr)0x0) {
LAB_0019864e:
            node_00 = (xmlNodePtr)0x0;
LAB_001986d0:
            ppxVar13 = local_38;
            if (*local_38 == (xmlChar *)0x0) {
              local = (xmlChar **)0x0;
              xmlSchemaPCustomErrExt
                        (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,pxVar10,
                         "Either the attribute \'itemType\' or the <simpleType> child must be present"
                         ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
          }
          else {
            if (((node_00->ns != (xmlNs *)0x0) &&
                (iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
               (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar5 != 0)) {
              pxVar8 = xmlSchemaParseAnnotation(ctxt,node_00,1);
              xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)annItem,pxVar8);
              node_00 = node_00->next;
              if (node_00 == (_xmlNode *)0x0) goto LAB_0019864e;
            }
            if (((node_00->ns == (xmlNs *)0x0) ||
                (iVar5 = xmlStrEqual(node_00->name,"simpleType"), iVar5 == 0)) ||
               (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar5 == 0)) goto LAB_001986d0;
            if (*local_38 == (xmlChar *)0x0) {
              pxVar9 = xmlSchemaParseSimpleType(ctxt,schema,node_00,0);
              annItem->subtypes = pxVar9;
            }
            else {
              local = (xmlChar **)0x0;
              xmlSchemaPCustomErrExt
                        (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,pxVar10,
                         "The attribute \'itemType\' and the <simpleType> child are mutually exclusive"
                         ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            node_00 = node_00->next;
            ppxVar13 = local_38;
          }
          if (node_00 != (xmlNodePtr)0x0) {
            xmlSchemaPContentErr
                      (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar10,node_00,
                       (xmlNodePtr)0x0,"(annotation?, simpleType?)",(char *)local);
          }
          if (((*ppxVar13 == (xmlChar *)0x0) && (annItem->subtypes == (xmlSchemaTypePtr)0x0)) &&
             (pxVar6 = xmlSchemaGetPropNode(pxVar10,"itemType"), pxVar6 == (xmlAttrPtr)0x0)) {
            local = (xmlChar **)0x0;
            bVar4 = false;
            xmlSchemaPCustomErrExt
                      (ctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_1,(xmlSchemaBasicItemPtr)0x0,pxVar10,
                       "Either the attribute \'itemType\' or the <simpleType> child must be present"
                       ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            goto LAB_00198780;
          }
        }
        bVar4 = false;
      }
      else {
        xmlSchemaParseRestriction(ctxt,schema,pxVar10,XML_SCHEMA_TYPE_SIMPLE);
        bVar4 = true;
      }
LAB_00198780:
      pxVar10 = pxVar10->next;
      if (pxVar10 == (xmlNodePtr)0x0) goto LAB_001987a6;
    }
    error = XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED;
  }
  xmlSchemaPContentErr
            (ctxt,error,(xmlSchemaBasicItemPtr)node,pxVar10,(xmlNodePtr)0x0,
             "(annotation?, (restriction | list | union))",(char *)local);
LAB_001987a6:
  if ((local_3c != 0) && (!bVar4 && ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
               "This is a redefinition, thus the <simpleType> must have a <restriction> child",
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  ctxt->ctxtType = pxVar3;
  return pxVar7;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseSimpleType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                         xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, oldCtxtType;
    xmlNodePtr child = NULL;
    const xmlChar *attrValue = NULL;
    xmlAttrPtr attr;
    int hasRestriction = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node,
		"name", NULL);
	    return (NULL);
	} else {
	    if (xmlSchemaPValAttrNode(ctxt,
		NULL, attr,
		xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &attrValue) != 0)
		return (NULL);
	    /*
	    * Skip built-in types.
	    */
	    if (ctxt->isS4S) {
		xmlSchemaTypePtr biType;

		if (ctxt->isRedefine) {
		    /*
		    * REDEFINE: Disallow redefinition of built-in-types.
		    * TODO: It seems that the spec does not say anything
		    * about this case.
		    */
		    xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
			NULL, node,
			"Redefinition of built-in simple types is not "
			"supported", NULL);
		    return(NULL);
		}
		biType = xmlSchemaGetPredefinedType(attrValue, xmlSchemaNs);
		if (biType != NULL)
		    return (biType);
	    }
	}
    }
    /*
    * TargetNamespace:
    * SPEC "The `actual value` of the targetNamespace [attribute]
    * of the <schema> ancestor element information item if present,
    * otherwise `absent`.
    */
    if (topLevel == 0) {
#ifdef ENABLE_NAMED_LOCALS
        char buf[40];
#endif
	/*
	* Parse as local simple type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#ST%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_SIMPLE,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Parse as global simple type definition.
	*
	* Note that attrValue is the value of the attribute "name" here.
	*/
	type = xmlSchemaAddType(ctxt, schema, XML_SCHEMA_TYPE_SIMPLE,
	    attrValue, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->type = XML_SCHEMA_TYPE_SIMPLE;
	type->contentType = XML_SCHEMA_CONTENT_SIMPLE;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "final"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Attribute "final".
	*/
	attr = xmlSchemaGetPropNode(node, "final");
	if (attr == NULL) {
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_LIST)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_LIST;
	    if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_UNION)
		type->flags |= XML_SCHEMAS_TYPE_FINAL_UNION;
	} else {
	    attrValue = xmlSchemaGetProp(ctxt, node, "final");
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
		-1, -1, XML_SCHEMAS_TYPE_FINAL_RESTRICTION, -1,
		XML_SCHEMAS_TYPE_FINAL_LIST,
		XML_SCHEMAS_TYPE_FINAL_UNION) != 0) {

		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    WXS_BASIC_CAST type, (xmlNodePtr) attr,
		    NULL, "(#all | List of (list | union | restriction)",
		    attrValue, NULL, NULL, NULL);
	    }
	}
    }
    type->targetNamespace = ctxt->targetNamespace;
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    oldCtxtType = ctxt->ctxtType;

    ctxt->ctxtType = type;

    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (child == NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_MISSING,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    } else if (IS_SCHEMA(child, "restriction")) {
        xmlSchemaParseRestriction(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SIMPLE);
	hasRestriction = 1;
        child = child->next;
    } else if (IS_SCHEMA(child, "list")) {
        xmlSchemaParseList(ctxt, schema, child);
        child = child->next;
    } else if (IS_SCHEMA(child, "union")) {
        xmlSchemaParseUnion(ctxt, schema, child);
        child = child->next;
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (restriction | list | union))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    * "Within the [children], each <simpleType> must have a
    * <restriction> among its [children] ... the `actual value` of whose
    * base [attribute] must be the same as the `actual value` of its own
    * name attribute plus target namespace;"
    */
    if (topLevel && ctxt->isRedefine && (! hasRestriction)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<simpleType> must have a <restriction> child", NULL);
    }

    ctxt->ctxtType = oldCtxtType;
    return (type);
}